

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GroupDestinationRecord *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GroupDestinationRecord *local_18;
  GroupDestinationRecord *this_local;
  
  local_18 = this;
  this_local = (GroupDestinationRecord *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Group Destination Record");
  poVar1 = std::operator<<(poVar1,"\nGroup Bit Field:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32GrpBtField);
  poVar1 = std::operator<<(poVar1,"\nPriority:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8DstPriority);
  poVar1 = std::operator<<(poVar1,"\nLine State Command:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8LnStCmd);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GroupDestinationRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Group Destination Record"
       << "\nGroup Bit Field:       " << m_ui32GrpBtField
       << "\nPriority:              " << ( KUINT16 )m_ui8DstPriority
       << "\nLine State Command:    " << ( KUINT16 )m_ui8LnStCmd
       << "\n";

    return ss.str();
}